

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

lua_Unsigned lua_tounsignedx(lua_State *L,int idx,int *isnum)

{
  TValue *obj;
  int iVar1;
  luai_Cast u;
  TValue n;
  lua_Unsigned local_20;
  TValue local_18;
  
  obj = index2addr(L,idx);
  if (obj->tt_ != 3) {
    obj = luaV_tonumber(obj,&local_18);
    if (obj == (TValue *)0x0) {
      iVar1 = 0;
      local_20 = 0;
      goto LAB_0010591a;
    }
  }
  local_20 = SUB84((obj->value_).n + 6755399441055744.0,0);
  iVar1 = 1;
LAB_0010591a:
  if (isnum != (int *)0x0) {
    *isnum = iVar1;
  }
  return local_20;
}

Assistant:

LUA_API lua_Unsigned lua_tounsignedx (lua_State *L, int idx, int *isnum) {
  TValue n;
  const TValue *o = index2addr(L, idx);
  if (tonumber(o, &n)) {
    lua_Unsigned res;
    lua_Number num = nvalue(o);
    lua_number2unsigned(res, num);
    if (isnum) *isnum = 1;
    return res;
  }
  else {
    if (isnum) *isnum = 0;
    return 0;
  }
}